

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

bool __thiscall cmListFileParser::ParseFunction(cmListFileParser *this,char *name,long line)

{
  bool bVar1;
  cmListFileLexer_Token *pcVar2;
  ostream *poVar3;
  char *pcVar4;
  anon_enum_32 aVar5;
  long lVar6;
  char *local_1c8 [4];
  ostringstream error;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  long local_188;
  pointer pcStack_180;
  pointer local_178;
  pointer pcStack_170;
  
  _error = (pointer)&local_198;
  local_198._M_allocated_capacity = 0;
  local_198._8_8_ = 0;
  local_188 = 0;
  pcStack_180 = (pointer)0x0;
  local_178 = (pointer)0x0;
  pcStack_170 = (pointer)0x0;
  cmListFileFunction::operator=(&this->Function,(cmListFileFunction *)&error);
  cmListFileFunction::~cmListFileFunction((cmListFileFunction *)&error);
  std::__cxx11::string::assign((char *)&this->Function);
  (this->Function).super_cmCommandContext.Line = line;
  do {
    pcVar2 = cmListFileLexer_Scan(this->Lexer);
    if (pcVar2 == (cmListFileLexer_Token *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
      poVar3 = std::operator<<((ostream *)&error,"Error in cmake code at\n");
      poVar3 = std::operator<<(poVar3,this->FileName);
      poVar3 = std::operator<<(poVar3,":");
      cmListFileLexer_GetCurrentLine(this->Lexer);
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      poVar3 = std::operator<<(poVar3,":\n");
      std::operator<<(poVar3,"Parse error.  Function missing opening \"(\".");
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(local_1c8[0],(char *)0x0,(char *)0x0,(char *)0x0);
      goto LAB_002e0575;
    }
  } while (pcVar2->type == cmListFileLexer_Token_Space);
  if (pcVar2->type != cmListFileLexer_Token_ParenLeft) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
    poVar3 = std::operator<<((ostream *)&error,"Error in cmake code at\n");
    poVar3 = std::operator<<(poVar3,this->FileName);
    poVar3 = std::operator<<(poVar3,":");
    cmListFileLexer_GetCurrentLine(this->Lexer);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3,":\n");
    poVar3 = std::operator<<(poVar3,"Parse error.  Expected \"(\", got ");
    pcVar4 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar2->type);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3," with text \"");
    poVar3 = std::operator<<(poVar3,pcVar2->text);
    std::operator<<(poVar3,"\".");
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(local_1c8[0],(char *)0x0,(char *)0x0,(char *)0x0);
LAB_002e0575:
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
    return false;
  }
  aVar5 = SeparationOkay;
  lVar6 = 0;
LAB_002e01c7:
  this->Separation = aVar5;
  do {
    cmListFileLexer_GetCurrentLine(this->Lexer);
    pcVar2 = cmListFileLexer_Scan(this->Lexer);
    if (pcVar2 == (cmListFileLexer_Token *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
      poVar3 = std::operator<<((ostream *)&error,"Error in cmake code at\n");
      poVar3 = std::operator<<(poVar3,this->FileName);
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,":\n");
      poVar3 = std::operator<<(poVar3,"Parse error.  Function missing ending \")\".  ");
      std::operator<<(poVar3,"End of file reached.");
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(local_1c8[0],(char *)0x0,(char *)0x0,(char *)0x0);
      goto LAB_002e0575;
    }
    aVar5 = SeparationWarning;
    switch(pcVar2->type) {
    case cmListFileLexer_Token_Space:
    case cmListFileLexer_Token_Newline:
      this->Separation = SeparationOkay;
      break;
    case cmListFileLexer_Token_Identifier:
    case cmListFileLexer_Token_ArgumentUnquoted:
      goto switchD_002e0200_caseD_3;
    case cmListFileLexer_Token_ParenLeft:
      lVar6 = lVar6 + 1;
      this->Separation = SeparationOkay;
      bVar1 = AddArgument(this,pcVar2,Unquoted);
      if (!bVar1) {
        return false;
      }
      break;
    case cmListFileLexer_Token_ParenRight:
      if (lVar6 == 0) {
        return true;
      }
      this->Separation = SeparationOkay;
      bVar1 = AddArgument(this,pcVar2,Unquoted);
      if (!bVar1) {
        return false;
      }
      lVar6 = lVar6 + -1;
      aVar5 = SeparationWarning;
      goto LAB_002e01c7;
    case cmListFileLexer_Token_ArgumentQuoted:
      bVar1 = AddArgument(this,pcVar2,Quoted);
      goto LAB_002e029f;
    case cmListFileLexer_Token_ArgumentBracket:
      bVar1 = AddArgument(this,pcVar2,Bracket);
      aVar5 = SeparationError;
      goto LAB_002e029f;
    case cmListFileLexer_Token_CommentBracket:
      aVar5 = SeparationError;
      goto LAB_002e01c7;
    default:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
      poVar3 = std::operator<<((ostream *)&error,"Error in cmake code at\n");
      poVar3 = std::operator<<(poVar3,this->FileName);
      poVar3 = std::operator<<(poVar3,":");
      cmListFileLexer_GetCurrentLine(this->Lexer);
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      poVar3 = std::operator<<(poVar3,":\n");
      poVar3 = std::operator<<(poVar3,"Parse error.  Function missing ending \")\".  ");
      poVar3 = std::operator<<(poVar3,"Instead found ");
      pcVar4 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar2->type);
      poVar3 = std::operator<<(poVar3,pcVar4);
      poVar3 = std::operator<<(poVar3," with text \"");
      poVar3 = std::operator<<(poVar3,pcVar2->text);
      std::operator<<(poVar3,"\".");
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(local_1c8[0],(char *)0x0,(char *)0x0,(char *)0x0);
      goto LAB_002e0575;
    }
  } while( true );
switchD_002e0200_caseD_3:
  bVar1 = AddArgument(this,pcVar2,Unquoted);
LAB_002e029f:
  if (bVar1 == false) {
    return false;
  }
  goto LAB_002e01c7;
}

Assistant:

bool cmListFileParser::ParseFunction(const char* name, long line)
{
  // Inintialize a new function call.
  this->Function = cmListFileFunction();
  this->Function.Name = name;
  this->Function.Line = line;

  // Command name has already been parsed.  Read the left paren.
  cmListFileLexer_Token* token;
  while((token = cmListFileLexer_Scan(this->Lexer)) &&
        token->type == cmListFileLexer_Token_Space) {}
  if(!token)
    {
    std::ostringstream error;
    error << "Error in cmake code at\n" << this->FileName << ":"
          << cmListFileLexer_GetCurrentLine(this->Lexer) << ":\n"
          << "Parse error.  Function missing opening \"(\".";
    cmSystemTools::Error(error.str().c_str());
    return false;
    }
  if(token->type != cmListFileLexer_Token_ParenLeft)
    {
    std::ostringstream error;
    error << "Error in cmake code at\n" << this->FileName << ":"
          << cmListFileLexer_GetCurrentLine(this->Lexer) << ":\n"
          << "Parse error.  Expected \"(\", got "
          << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
          << " with text \"" << token->text << "\".";
    cmSystemTools::Error(error.str().c_str());
    return false;
    }

  // Arguments.
  unsigned long lastLine;
  unsigned long parenDepth = 0;
  this->Separation = SeparationOkay;
  while((lastLine = cmListFileLexer_GetCurrentLine(this->Lexer),
         token = cmListFileLexer_Scan(this->Lexer)))
    {
    if(token->type == cmListFileLexer_Token_Space ||
       token->type == cmListFileLexer_Token_Newline)
      {
      this->Separation = SeparationOkay;
      continue;
      }
    if(token->type == cmListFileLexer_Token_ParenLeft)
      {
      parenDepth++;
      this->Separation = SeparationOkay;
      if(!this->AddArgument(token, cmListFileArgument::Unquoted))
        {
        return false;
        }
      }
    else if(token->type == cmListFileLexer_Token_ParenRight)
      {
      if (parenDepth == 0)
        {
        return true;
        }
      parenDepth--;
      this->Separation = SeparationOkay;
      if(!this->AddArgument(token, cmListFileArgument::Unquoted))
        {
        return false;
        }
      this->Separation = SeparationWarning;
      }
    else if(token->type == cmListFileLexer_Token_Identifier ||
            token->type == cmListFileLexer_Token_ArgumentUnquoted)
      {
      if(!this->AddArgument(token, cmListFileArgument::Unquoted))
        {
        return false;
        }
      this->Separation = SeparationWarning;
      }
    else if(token->type == cmListFileLexer_Token_ArgumentQuoted)
      {
      if(!this->AddArgument(token, cmListFileArgument::Quoted))
        {
        return false;
        }
      this->Separation = SeparationWarning;
      }
    else if(token->type == cmListFileLexer_Token_ArgumentBracket)
      {
      if(!this->AddArgument(token, cmListFileArgument::Bracket))
        {
        return false;
        }
      this->Separation = SeparationError;
      }
    else if(token->type == cmListFileLexer_Token_CommentBracket)
      {
      this->Separation = SeparationError;
      }
    else
      {
      // Error.
      std::ostringstream error;
      error << "Error in cmake code at\n" << this->FileName << ":"
            << cmListFileLexer_GetCurrentLine(this->Lexer) << ":\n"
            << "Parse error.  Function missing ending \")\".  "
            << "Instead found "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \"" << token->text << "\".";
      cmSystemTools::Error(error.str().c_str());
      return false;
      }
    }

  std::ostringstream error;
  error << "Error in cmake code at\n"
        << this->FileName << ":" << lastLine << ":\n"
        << "Parse error.  Function missing ending \")\".  "
        << "End of file reached.";
  cmSystemTools::Error(error.str().c_str());

  return false;
}